

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed,char *name,HelicsError *err)

{
  string_view name_00;
  bool bVar1;
  element_type *__str;
  Filter *pFVar2;
  pointer pFVar3;
  long in_RSI;
  __sv_type _Var4;
  __single_object filt;
  shared_ptr<helics::Federate> fedObj;
  shared_ptr<helics::Federate> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  shared_ptr<helics::Federate> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *this_00;
  HelicsFederate in_stack_ffffffffffffff18;
  allocator<char> *__a;
  _Head_base<0UL,_helics::FilterObject_*,_false> in_stack_ffffffffffffff40;
  bool local_b2;
  allocator<char> local_b1 [9];
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
  *in_stack_ffffffffffffff58;
  HelicsFederate in_stack_ffffffffffffff60;
  Federate *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff88;
  shared_ptr<helics::Federate> local_40;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_30;
  long local_18;
  HelicsFilter local_8;
  
  local_18 = in_RSI;
  getFedSharedPtr(in_stack_ffffffffffffff18,(HelicsError *)in_stack_ffffffffffffff10);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_30);
  if (bVar1) {
    std::make_unique<helics::FilterObject>();
    __str = std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::get(&local_30);
    std::__cxx11::string::string(in_stack_ffffffffffffff10);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    if (local_18 == 0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40._M_head_impl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    }
    else {
      __a = local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40._M_head_impl,(char *)__str,__a);
    }
    local_b2 = local_18 != 0;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    name_00._M_str = in_stack_ffffffffffffff80;
    name_00._M_len = (size_t)_Var4._M_str;
    pFVar2 = &helics::make_cloning_filter
                        (_Var4._M_len._4_4_,in_stack_ffffffffffffff68,in_stack_ffffffffffffff88,
                         name_00)->super_Filter;
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e613c);
    pFVar3->filtPtr = pFVar2;
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    if (local_b2) {
      std::allocator<char>::~allocator(local_b1);
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    this = &local_40;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e6181);
    std::shared_ptr<helics::Federate>::operator=(this,in_stack_fffffffffffffef8);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e619f);
    pFVar3->cloning = true;
    this_00 = (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
              &stack0xffffffffffffff40;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)this,
               (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               in_stack_fffffffffffffef8);
    local_8 = anon_unknown.dwarf_88686::federateAddFilter
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
    local_40.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
  }
  else {
    local_8 = (HelicsFilter)0x0;
    local_40.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1e6313);
  return local_8;
}

Assistant:

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_cloning_filter(helics::FilterTypes::CLONE, fedObj.get(), std::string{}, AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->cloning = true;
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}